

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O0

void __thiscall
DIS::LinearSegmentParameter::unmarshal(LinearSegmentParameter *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  LinearSegmentParameter *this_local;
  
  DataStream::operator>>(dataStream,&this->_segmentNumber);
  DataStream::operator>>(dataStream,&this->_segmentModification);
  DataStream::operator>>(dataStream,&this->_generalSegmentAppearance);
  DataStream::operator>>(dataStream,&this->_specificSegmentAppearance);
  Vector3Double::unmarshal(&this->_segmentLocation,dataStream);
  EulerAngles::unmarshal(&this->_segmentOrientation,dataStream);
  DataStream::operator>>(dataStream,&this->_segmentLength);
  DataStream::operator>>(dataStream,&this->_segmentWidth);
  DataStream::operator>>(dataStream,&this->_segmentHeight);
  DataStream::operator>>(dataStream,&this->_segmentDepth);
  return;
}

Assistant:

void LinearSegmentParameter::unmarshal(DataStream& dataStream)
{
    dataStream >> _segmentNumber;
    dataStream >> _segmentModification;
    dataStream >> _generalSegmentAppearance;
    dataStream >> _specificSegmentAppearance;
    _segmentLocation.unmarshal(dataStream);
    _segmentOrientation.unmarshal(dataStream);
    dataStream >> _segmentLength;
    dataStream >> _segmentWidth;
    dataStream >> _segmentHeight;
    dataStream >> _segmentDepth;
}